

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

bool sptk::ConvertSpecialStringToDouble(string *input,double *output)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  long lVar6;
  size_type sVar7;
  double tmp;
  double local_78;
  string lowercase_input;
  string local_50;
  
  if (output == (double *)0x0) {
    return false;
  }
  if (input->_M_string_length == 0) {
    return false;
  }
  std::__cxx11::string::string((string *)&lowercase_input,(string *)input);
  pcVar1 = (input->_M_dataplus)._M_p;
  sVar2 = input->_M_string_length;
  for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
    iVar4 = tolower((uint)(byte)pcVar1[sVar7]);
    lowercase_input._M_dataplus._M_p[sVar7] = (char)iVar4;
  }
  bVar3 = std::operator==("pi",&lowercase_input);
  if (bVar3) {
    dVar5 = 3.141592653589793;
LAB_00105e2f:
    *output = dVar5;
  }
  else {
    bVar3 = std::operator==("db",&lowercase_input);
    if (bVar3) {
      dVar5 = 8.685889638065035;
      goto LAB_00105e2f;
    }
    bVar3 = std::operator==("cent",&lowercase_input);
    if (bVar3) {
      dVar5 = 1731.2340490667555;
      goto LAB_00105e2f;
    }
    bVar3 = std::operator==("semitone",&lowercase_input);
    if (bVar3) {
      dVar5 = 17.312340490667555;
      goto LAB_00105e2f;
    }
    bVar3 = std::operator==("octave",&lowercase_input);
    if (bVar3) {
      dVar5 = 1.442695040888963;
      goto LAB_00105e2f;
    }
    lVar6 = std::__cxx11::string::find((char *)&lowercase_input,0x10b906);
    if (lVar6 != 0) {
      lVar6 = std::__cxx11::string::find((char *)&lowercase_input,0x10b90b);
      if (lVar6 == 0) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&lowercase_input);
        bVar3 = ConvertStringToDouble(&local_50,&tmp);
        local_78 = tmp;
        std::__cxx11::string::~string((string *)&local_50);
        if ((bVar3) && (0.0 < local_78)) {
          dVar5 = log(tmp);
          goto LAB_00105fc6;
        }
      }
      else {
        bVar3 = false;
        lVar6 = std::__cxx11::string::find((char *)&lowercase_input,0x10b90e);
        if (lVar6 != 0) goto LAB_00105e35;
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&lowercase_input);
        bVar3 = ConvertStringToDouble(&local_50,&tmp);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar3) {
          dVar5 = exp(tmp);
          goto LAB_00105fc6;
        }
      }
LAB_00105fb9:
      bVar3 = false;
      goto LAB_00105e35;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&lowercase_input);
    bVar3 = ConvertStringToDouble(&local_50,&tmp);
    local_78 = tmp;
    std::__cxx11::string::~string((string *)&local_50);
    if ((!bVar3) || (local_78 < 0.0)) goto LAB_00105fb9;
    if (tmp < 0.0) {
      dVar5 = sqrt(tmp);
    }
    else {
      dVar5 = SQRT(tmp);
    }
LAB_00105fc6:
    *output = dVar5;
  }
  bVar3 = true;
LAB_00105e35:
  std::__cxx11::string::~string((string *)&lowercase_input);
  return bVar3;
}

Assistant:

bool ConvertSpecialStringToDouble(const std::string& input, double* output) {
  if (input.empty() || NULL == output) {
    return false;
  }

  std::string lowercase_input(input);
  std::transform(input.begin(), input.end(), lowercase_input.begin(),
                 [](unsigned char c) {
                   return static_cast<unsigned char>(std::tolower(c));
                 });
  if ("pi" == lowercase_input) {
    *output = sptk::kPi;
    return true;
  } else if ("db" == lowercase_input) {
    *output = sptk::kNeper;
    return true;
  } else if ("cent" == lowercase_input) {
    *output = 1200.0 * sptk::kOctave;
    return true;
  } else if ("semitone" == lowercase_input) {
    *output = 12.0 * sptk::kOctave;
    return true;
  } else if ("octave" == lowercase_input) {
    *output = sptk::kOctave;
    return true;
  } else if (lowercase_input.find("sqrt") == 0) {
    double tmp;
    if (ConvertStringToDouble(lowercase_input.substr(4), &tmp) && 0.0 <= tmp) {
      *output = std::sqrt(tmp);
      return true;
    }
  } else if (lowercase_input.find("ln") == 0) {
    double tmp;
    if (ConvertStringToDouble(lowercase_input.substr(2), &tmp) && 0.0 < tmp) {
      *output = std::log(tmp);
      return true;
    }
  } else if (lowercase_input.find("exp") == 0) {
    double tmp;
    if (ConvertStringToDouble(lowercase_input.substr(3), &tmp)) {
      *output = std::exp(tmp);
      return true;
    }
  }

  return false;
}